

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall Sudoku::restart(Sudoku *this)

{
  int iVar1;
  int iVar2;
  int local_1d8;
  int i;
  int y;
  int x;
  Sudoku temp;
  Sudoku *this_local;
  
  temp.s._436_8_ = this;
  Sudoku((Sudoku *)&y,-1);
  for (local_1d8 = 0; local_1d8 < 0x51; local_1d8 = local_1d8 + 1) {
    if ((*(byte *)((this->s).pole + local_1d8) >> 4 & 1) != 0) {
      *(sudoku_policko *)(&y + local_1d8) = (this->s).pole[local_1d8];
      iVar2 = local_1d8 % 9;
      iVar1 = local_1d8 / 9;
      temp.s.sloupce[(long)iVar1 + 7] =
           1 << (*(byte *)((this->s).pole + local_1d8) & 0xf) | temp.s.sloupce[(long)iVar1 + 7];
      temp.s.sloupce[(long)iVar2 + -2] =
           1 << (*(byte *)((this->s).pole + local_1d8) & 0xf) | temp.s.sloupce[(long)iVar2 + -2];
      temp.s.ctverce[(long)(iVar2 / 3) + -1][(long)(iVar1 / 3) + 1] =
           1 << (*(byte *)((this->s).pole + local_1d8) & 0xf) |
           temp.s.ctverce[(long)(iVar2 / 3) + -1][(long)(iVar1 / 3) + 1];
      temp.s.ctverce[2][2] = temp.s.ctverce[2][2] + 1;
    }
  }
  memcpy(this,&y,0x1bc);
  ~Sudoku((Sudoku *)&y);
  return;
}

Assistant:

void Sudoku::restart( void )
{
  Sudoku temp(-1); // operace probiha kopirovanim do docasneho sudoku
  int x,y;
  for(int i = 0; i< 81; i++)// projdeme vse
  {
    if(s.pole[i].pevne)// narazime-li na pevne cislo
    {
      // prekopirujeme jeho stav
      temp.s.pole[i] = s.pole[i];
      x = i % 9;
      y = i / 9;
      // a nastavime zakazane hodnoty pro radky/sloupce/ctverce
      temp.s.radky[y] |= (1 << s.pole[i].zapsane);
      temp.s.sloupce[x] |= (1 << s.pole[i].zapsane);
      temp.s.ctverce[x/3][y/3] |= (1 << s.pole[i].zapsane);
      temp.s.doplnenych ++; // mame dalsi doplnene cislo
    }
  }
  // preneseni stavu z docasneho sudoku do puvodniho (tohoto)
  s = temp.s;
}